

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sdiv(APInt *this,APInt *RHS)

{
  bool bVar1;
  bool bVar2;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  APInt *this_00;
  APInt *this_01;
  APInt AVar4;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  undefined8 uVar3;
  
  bVar1 = isNegative(RHS);
  bVar2 = isNegative(in_RDX);
  if (bVar1) {
    if (bVar2) {
      this_00 = &local_40;
      APInt(this_00,RHS);
      operator-((llvm *)&local_b0,this_00);
      this_01 = &local_60;
      APInt(this_01,in_RDX);
      operator-((llvm *)&local_50,this_01);
      udiv(this,&local_b0);
      ~APInt(&local_50);
    }
    else {
      this_00 = &local_80;
      APInt(this_00,RHS);
      operator-((llvm *)&local_b0,this_00);
      this_01 = &local_70;
      udiv(this_01,&local_b0);
      operator-((llvm *)this,this_01);
    }
    ~APInt(this_01);
  }
  else {
    if (!bVar2) {
      AVar4 = udiv(this,RHS);
      uVar3 = AVar4._8_8_;
      goto LAB_00168fd3;
    }
    this_00 = &local_a0;
    APInt(this_00,in_RDX);
    operator-((llvm *)&local_b0,this_00);
    udiv(&local_90,RHS);
    operator-((llvm *)this,&local_90);
    ~APInt(&local_90);
  }
  ~APInt(&local_b0);
  ~APInt(this_00);
  uVar3 = extraout_RDX;
LAB_00168fd3:
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::sdiv(const APInt &RHS) const {
  if (isNegative()) {
    if (RHS.isNegative())
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS.isNegative())
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}